

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void __thiscall ON_XMLNodePrivate::RemoveAllChildren(ON_XMLNodePrivate *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_XMLNode *pDelete;
  ON_XMLNode *pOVar2;
  
  std::recursive_mutex::lock(&this->m_mutex);
  pOVar2 = this->m_first_child;
  if (pOVar2 != (ON_XMLNode *)0x0) {
    while (pOVar2 != (ON_XMLNode *)0x0) {
      iVar1 = (*pOVar2->_vptr_ON_XMLNode[7])(pOVar2);
      (*pOVar2->_vptr_ON_XMLNode[1])(pOVar2);
      pOVar2 = (ON_XMLNode *)CONCAT44(extraout_var,iVar1);
    }
    this->m_first_child = (ON_XMLNode *)0x0;
    this->m_last_child = (ON_XMLNode *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ON_XMLNodePrivate::RemoveAllChildren(void)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr == m_first_child)
    return;

  auto* pNode = m_first_child;
  while (nullptr != pNode)
  {
    auto* pDelete = pNode;
    pNode = pNode->NextSibling();
    delete pDelete;
  }

  m_first_child = nullptr;
  m_last_child = nullptr;
}